

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

char read_tag(char *dst,size_t dstlen,int *is_end_tag,char **s,size_t *slen,out_stream_info *stream)

{
  byte *pbVar1;
  byte bVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (slen != (size_t *)0x0) {
    outchar_noxlat_stream((out_stream_info *)slen,G_cmap_output[0x3c]);
  }
  if (*s == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    *s = *s + -1;
    pbVar1 = *(byte **)is_end_tag;
    *(byte **)is_end_tag = pbVar1 + 1;
    uVar4 = (ulong)*pbVar1;
  }
  if (-1 < (char)uVar4) {
    ppuVar3 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar3 + uVar4 * 2 + 1) & 0x20) == 0) break;
      bVar2 = nextout_copy((char **)is_end_tag,(size_t *)s,(char)uVar4,(out_stream_info *)slen);
      uVar4 = (ulong)bVar2;
    } while (-1 < (char)bVar2);
  }
  if (((char)uVar4 == '\\') || ((int)uVar4 == 0x2f)) {
    *(undefined4 *)dstlen = 1;
    bVar2 = nextout_copy((char **)is_end_tag,(size_t *)s,(char)uVar4,(out_stream_info *)slen);
    uVar4 = (ulong)bVar2;
    if (-1 < (char)bVar2) {
      ppuVar3 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar3 + uVar4 * 2 + 1) & 0x20) == 0) break;
        bVar2 = nextout_copy((char **)is_end_tag,(size_t *)s,(char)uVar4,(out_stream_info *)slen);
        uVar4 = (ulong)bVar2;
      } while (-1 < (char)bVar2);
    }
  }
  else {
    *(undefined4 *)dstlen = 0;
  }
  if ((char)uVar4 == '\0') {
    bVar6 = false;
    bVar2 = 0;
  }
  else {
    uVar5 = 0x32;
    do {
      bVar2 = (byte)uVar4;
      if ((-1 < (char)bVar2) &&
         ((ppuVar3 = __ctype_b_loc(), bVar2 == 0x3e || (((*ppuVar3)[uVar4] & 0x2000) != 0)))) break;
      if (1 < uVar5) {
        *dst = bVar2;
        dst = (char *)((byte *)dst + 1);
        uVar5 = uVar5 - 1;
      }
      bVar2 = nextout_copy((char **)is_end_tag,(size_t *)s,bVar2,(out_stream_info *)slen);
      uVar4 = (ulong)bVar2;
    } while (bVar2 != 0);
    bVar6 = uVar5 == 0;
  }
  if (!bVar6) {
    *dst = 0;
  }
  return bVar2;
}

Assistant:

static char read_tag(char *dst, size_t dstlen, int *is_end_tag,
                     char **s, size_t *slen, out_stream_info *stream)
{
    char c;
    
    /* skip the opening '<' */
    c = nextout_copy(s, slen, '<', stream);

    /* skip spaces */
    while (outissp(c))
        c = nextout_copy(s, slen, c, stream);

    /* note if this is a closing tag */
    if (c == '/' || c == '\\')
    {
        /* it's an end tag - note it and skip the slash */
        *is_end_tag = TRUE;
        c = nextout_copy(s, slen, c, stream);

        /* skip yet more spaces */
        while (outissp(c))
            c = nextout_copy(s, slen, c, stream);
    }
    else
        *is_end_tag = FALSE;
    
    /* 
     *   find the end of the tag name - the tag continues to the next space,
     *   '>', or end of line 
     */
    for ( ; c != '\0' && !outissp(c) && c != '>' ;
         c = nextout_copy(s, slen, c, stream))
    {
        /* add this to the tag buffer if it fits */
        if (dstlen > 1)
        {
            *dst++ = c;
            --dstlen;
        }
    }
    
    /* null-terminate the tag name */
    if (dstlen > 0)
        *dst = '\0';

    /* return the next character */
    return c;
}